

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Prepare16(sqlite3 *db,void *zSql,int nBytes,u32 prepFlags,sqlite3_stmt **ppStmt,
                    void **pzTail)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  char *zSql_00;
  u8 enc;
  byte *pbVar4;
  byte *pbVar5;
  int sz;
  ulong uVar6;
  int iVar7;
  long in_FS_OFFSET;
  char *zTail8;
  long local_38;
  
  enc = (u8)prepFlags;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  zTail8 = (char *)0x0;
  *ppStmt = (sqlite3_stmt *)0x0;
  iVar2 = sqlite3SafetyCheckOk(db);
  if ((zSql == (void *)0x0) || (iVar2 == 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      iVar2 = sqlite3MisuseError(0x2318d);
      return iVar2;
    }
  }
  else {
    if (nBytes < 0) {
      for (uVar6 = 0;
          (*(char *)((long)zSql + uVar6) != '\0' || (*(char *)((long)zSql + uVar6 + 1) != '\0'));
          uVar6 = uVar6 + 2) {
      }
    }
    else {
      for (uVar6 = 0;
          (uVar6 < (uint)nBytes &&
          ((*(char *)((long)zSql + uVar6) != '\0' || (*(char *)((long)zSql + uVar6 + 1) != '\0'))));
          uVar6 = uVar6 + 2) {
      }
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    zSql_00 = sqlite3Utf16to8(db,zSql,(int)uVar6,enc);
    if (zSql_00 == (char *)0x0) {
      iVar2 = 0;
    }
    else {
      iVar7 = 0;
      iVar2 = sqlite3LockAndPrepare(db,zSql_00,-1,prepFlags,(Vdbe *)0x0,ppStmt,&zTail8);
      if (pzTail != (void **)0x0 && zTail8 != (char *)0x0) {
        iVar3 = sqlite3Utf8CharLen(zSql_00,(int)zTail8 - (int)zSql_00);
        pbVar4 = (byte *)((long)zSql + ((uVar6 & 0xffffffff) - 1));
        pbVar5 = (byte *)((long)zSql + 1);
        while ((iVar7 < iVar3 && (pbVar5 <= pbVar4))) {
          pbVar1 = pbVar5 + 2;
          if (((*pbVar5 & 0xfc) == 0xd8) && ((pbVar1 <= pbVar4 && ((pbVar5[2] & 0xfc) == 0xdc)))) {
            pbVar1 = pbVar5 + 4;
          }
          pbVar5 = pbVar1;
          iVar7 = iVar7 + 1;
        }
        *pzTail = (void *)((long)(int)((int)pbVar5 + ~(uint)zSql) + (long)zSql);
      }
    }
    sqlite3DbFree(db,zSql_00);
    iVar2 = sqlite3ApiExit(db,iVar2);
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return iVar2;
    }
  }
  __stack_chk_fail();
}

Assistant:

static int sqlite3Prepare16(
  sqlite3 *db,              /* Database handle. */
  const void *zSql,         /* UTF-16 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const void **pzTail       /* OUT: End of parsed string */
){
  /* This function currently works by first transforming the UTF-16
  ** encoded string to UTF-8, then invoking sqlite3_prepare(). The
  ** tricky bit is figuring out the pointer to return in *pzTail.
  */
  char *zSql8;
  const char *zTail8 = 0;
  int rc = SQLITE_OK;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppStmt==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppStmt = 0;
  if( !sqlite3SafetyCheckOk(db)||zSql==0 ){
    return SQLITE_MISUSE_BKPT;
  }

  /* Make sure nBytes is non-negative and correct.  It should be the
  ** number of bytes until the end of the input buffer or until the first
  ** U+0000 character.  If the input nBytes is odd, convert it into
  ** an even number.  If the input nBytes is negative, then the input
  ** must be terminated by at least one U+0000 character */
  if( nBytes>=0 ){
    int sz;
    const char *z = (const char*)zSql;
    for(sz=0; sz<nBytes && (z[sz]!=0 || z[sz+1]!=0); sz += 2){}
    nBytes = sz;
  }else{
    int sz;
    const char *z = (const char*)zSql;
    for(sz=0; z[sz]!=0 || z[sz+1]!=0; sz += 2){}
    nBytes = sz;
  }

  sqlite3_mutex_enter(db->mutex);
  zSql8 = sqlite3Utf16to8(db, zSql, nBytes, SQLITE_UTF16NATIVE);
  if( zSql8 ){
    rc = sqlite3LockAndPrepare(db, zSql8, -1, prepFlags, 0, ppStmt, &zTail8);
  }

  if( zTail8 && pzTail ){
    /* If sqlite3_prepare returns a tail pointer, we calculate the
    ** equivalent pointer into the UTF-16 string by counting the unicode
    ** characters between zSql8 and zTail8, and then returning a pointer
    ** the same number of characters into the UTF-16 string.
    */
    int chars_parsed = sqlite3Utf8CharLen(zSql8, (int)(zTail8-zSql8));
    *pzTail = (u8 *)zSql + sqlite3Utf16ByteLen(zSql, nBytes, chars_parsed);
  }
  sqlite3DbFree(db, zSql8);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}